

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O2

void CB_EXPLORE::finish(cb_explore *data)

{
  v_array<unsigned_int>::delete_v(&data->preds);
  v_array<float>::delete_v(&data->cover_probs);
  (*(code *)PTR_delete_label_002eab98)(&(data->cbcs).pred_scores);
  (*(code *)PTR_delete_label_002eab98)(&data->cs_label);
  (*(code *)PTR_delete_label_002eab98)(&data->second_cs_label);
  return;
}

Assistant:

void finish(cb_explore& data)
{
  data.preds.delete_v();
  data.cover_probs.delete_v();
  cb_to_cs& c = data.cbcs;
  COST_SENSITIVE::cs_label.delete_label(&c.pred_scores);
  COST_SENSITIVE::cs_label.delete_label(&data.cs_label);
  COST_SENSITIVE::cs_label.delete_label(&data.second_cs_label);
}